

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

void __thiscall
t_haxe_generator::generate_haxe_validator(t_haxe_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *field;
  t_type *ptVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  pointer pptVar6;
  char *pcVar7;
  string *psVar8;
  string local_98;
  pointer local_78;
  string local_70;
  string local_50;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"public function validate() : Void {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"// check for required fields");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    if ((*pptVar6)->req_ == T_REQUIRED) {
      bVar3 = type_can_be_null(this,(*pptVar6)->type_);
      poVar5 = t_generator::indent((t_generator *)this,out);
      if (bVar3) {
        poVar5 = std::operator<<(poVar5,"if (");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
        poVar5 = std::operator<<(poVar5," == null) {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,
                                 "  throw new TProtocolException(TProtocolException.UNKNOWN, \"Required field \'"
                                );
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
        poVar5 = std::operator<<(poVar5,"\' was not present! Struct: \" + toString());");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = t_generator::indent((t_generator *)this,out);
        pcVar7 = "}";
      }
      else {
        poVar5 = std::operator<<(poVar5,"// alas, we cannot check \'");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
        pcVar7 = "\' because it\'s a primitive.";
      }
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
  }
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"// check that fields of type enum have valid values");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    field = *pptVar6;
    ptVar2 = field->type_;
    iVar4 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])(ptVar2);
    if ((char)iVar4 != '\0') {
      local_78 = pptVar6;
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"if (");
      generate_isset_check_abi_cxx11_(&local_98,this,field);
      poVar5 = std::operator<<(poVar5,(string *)&local_98);
      poVar5 = std::operator<<(poVar5," && !");
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1f])
                (&local_70,this,ptVar2);
      get_cap_name(&local_50,this,&local_70);
      poVar5 = std::operator<<(poVar5,(string *)&local_50);
      poVar5 = std::operator<<(poVar5,".VALID_VALUES.contains(");
      psVar8 = &field->name_;
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5,")){");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_98);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,
                               "throw new TProtocolException(TProtocolException.UNKNOWN, \"The field \'"
                              );
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5,"\' has been assigned the invalid value \" + ");
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5,");");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      pptVar6 = local_78;
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_haxe_generator::generate_haxe_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "public function validate() : Void {" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent() << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      if (type_can_be_null((*f_iter)->get_type())) {
        indent(out) << "if (" << (*f_iter)->get_name() << " == null) {" << endl;
        indent(out)
            << "  throw new TProtocolException(TProtocolException.UNKNOWN, \"Required field '"
            << (*f_iter)->get_name() << "' was not present! Struct: \" + toString());" << endl;
        indent(out) << "}" << endl;
      } else {
        indent(out) << "// alas, we cannot check '" << (*f_iter)->get_name()
                    << "' because it's a primitive." << endl;
      }
    }
  }

  // check that fields of type enum have valid values
  out << indent() << "// check that fields of type enum have valid values" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);
    t_type* type = field->get_type();
    // if field is an enum, check that its value is valid
    if (type->is_enum()) {
      indent(out) << "if (" << generate_isset_check(field) << " && !"
                  << get_cap_name(get_enum_class_name(type)) << ".VALID_VALUES.contains("
                  << field->get_name() << ")){" << endl;
      indent_up();
      indent(out) << "throw new TProtocolException(TProtocolException.UNKNOWN, \"The field '"
                  << field->get_name() << "' has been assigned the invalid value \" + "
                  << field->get_name() << ");" << endl;
      indent_down();
      indent(out) << "}" << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;
}